

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall
helics::CoreBroker::findAndNotifyFilterTargets
          (CoreBroker *this,BasicHandleInfo *handleInfo,string *key)

{
  UnknownHandleManager *this_00;
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer pbVar5;
  uint uVar6;
  GlobalHandle GVar7;
  pointer pbVar8;
  ActionMessage link;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FiltSourceTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FiltDestTargets;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  local_138;
  undefined1 local_118 [8];
  GlobalHandle GStack_110;
  _Alloc_hider local_108;
  undefined8 local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [32];
  string local_c8;
  string *local_a8;
  string *local_a0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  this_00 = &this->unknownHandles;
  UnknownHandleManager::checkForFilters(&local_138,this_00,(string *)key);
  ppVar3 = local_138.
           super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_138.
      super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_138.
      super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    GVar7 = (GlobalHandle)
            local_138.
            super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar6 = handleInfo->flags & 0x200 |
              (uint)(ushort)(((GlobalHandle *)((long)GVar7 + 8))->fed_id).gid;
      local_118 = *(undefined1 (*) [8])GVar7;
      GStack_110.fed_id.gid = -2000000000;
      GStack_110.handle.hid = 0x65;
      local_108._M_p = (pointer)&local_f8;
      local_100 = 0;
      local_f8._M_local_buf[0] = '\0';
      local_e8._0_8_ = local_e8 + 0x10;
      local_e8._8_8_ = 0;
      local_e8[0x10] = '\0';
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      local_a8 = (string *)local_e8;
      local_a0 = &local_c8;
      local_98[0].
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98[0].
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98[0].
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      connectInterfaces(this,handleInfo,uVar6,(BasicHandleInfo *)local_118,uVar6,
                        (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                         )0x5a0000003e);
      CLI::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
        operator_delete((void *)local_e8._0_8_,CONCAT71(local_e8._17_7_,local_e8[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,
                        CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) + 1)
        ;
      }
      GVar7 = (GlobalHandle)((long)GVar7 + 0xc);
    } while (GVar7 != (GlobalHandle)ppVar3);
  }
  UnknownHandleManager::checkForFilterDestTargets(&local_48,this_00,(string *)key);
  pbVar5 = local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar8 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      ActionMessage::ActionMessage((ActionMessage *)local_118,cmd_add_named_endpoint);
      ppVar1 = (pointer)(pbVar8->_M_dataplus)._M_p;
      ppVar2 = (pointer)pbVar8->_M_string_length;
      if ((local_98[0].
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage != ppVar1) &&
         (SmallBuffer::reserve((SmallBuffer *)(local_e8 + 0x10),(size_t)ppVar2),
         ppVar2 != (pointer)0x0)) {
        local_98[0].
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = ppVar2;
        memcpy(local_98[0].
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,ppVar1,(size_t)ppVar2);
        ppVar2 = local_98[0].
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      local_98[0].
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = ppVar2;
      GStack_110 = handleInfo->handle;
      local_100 = CONCAT44(local_100._4_4_,CONCAT22(handleInfo->flags,(uint16_t)local_100)) |
                  0x20000;
      checkForNamedInterface(this,(ActionMessage *)local_118);
      ActionMessage::~ActionMessage((ActionMessage *)local_118);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar5);
  }
  UnknownHandleManager::checkForFilterSourceTargets(&local_60,this_00,(string *)key);
  pbVar5 = local_60.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar8 = local_60.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      ActionMessage::ActionMessage((ActionMessage *)local_118,cmd_add_named_endpoint);
      ppVar1 = (pointer)(pbVar8->_M_dataplus)._M_p;
      ppVar2 = (pointer)pbVar8->_M_string_length;
      if ((local_98[0].
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage != ppVar1) &&
         (SmallBuffer::reserve((SmallBuffer *)(local_e8 + 0x10),(size_t)ppVar2),
         ppVar2 != (pointer)0x0)) {
        local_98[0].
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = ppVar2;
        memcpy(local_98[0].
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,ppVar1,(size_t)ppVar2);
        ppVar2 = local_98[0].
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      local_98[0].
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = ppVar2;
      GStack_110 = handleInfo->handle;
      local_100 = CONCAT44(local_100._4_4_,CONCAT22(handleInfo->flags,(uint16_t)local_100));
      checkForNamedInterface(this,(ActionMessage *)local_118);
      ActionMessage::~ActionMessage((ActionMessage *)local_118);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar5);
  }
  if (((local_138.
        super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_138.
        super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) ||
      (local_48.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_48.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) ||
     (local_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    UnknownHandleManager::clearFilter(this_00,(string *)key);
  }
  if ((this->super_BrokerBase).brokerState._M_i == OPERATING) {
    UnknownHandleManager::checkForFilters
              ((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                *)local_118,this_00,(string *)key);
    ppVar4 = local_138.
             super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppVar3 = local_138.
             super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_138.
    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_118;
    local_138.
    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)GStack_110;
    local_138.
    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_108._M_p;
    local_118._0_4_ = 0;
    local_118._4_4_ = 0;
    GStack_110.fed_id.gid = 0;
    GStack_110.handle.hid = 0;
    local_108._M_p = (pointer)0x0;
    if ((GlobalHandle)ppVar3 != (GlobalHandle)0x0) {
      operator_delete(ppVar3,(long)ppVar4 - (long)ppVar3);
    }
    if ((GlobalHandle)local_118 != (GlobalHandle)0x0) {
      operator_delete((void *)local_118,(long)local_108._M_p - (long)local_118);
    }
    ppVar3 = local_138.
             super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_138.
        super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_138.
        super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      GVar7 = (GlobalHandle)
              local_138.
              super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      do {
        uVar6 = handleInfo->flags & 0x200 | (uint)*(ushort *)((long)GVar7 + 8);
        local_118 = *(undefined1 (*) [8])GVar7;
        GStack_110.fed_id.gid = -2000000000;
        GStack_110.handle.hid = 0x65;
        local_108._M_p = (pointer)&local_f8;
        local_100 = 0;
        local_f8._M_local_buf[0] = '\0';
        local_e8._0_8_ = local_e8 + 0x10;
        local_e8._8_8_ = 0;
        local_e8[0x10] = '\0';
        local_c8._M_string_length = 0;
        local_c8.field_2._M_local_buf[0] = '\0';
        local_a8 = (string *)local_e8;
        local_a0 = &local_c8;
        local_98[0].
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_98[0].
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_98[0].
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        connectInterfaces(this,handleInfo,uVar6,(BasicHandleInfo *)local_118,uVar6,
                          (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                           )0x5a0000003e);
        CLI::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                   local_c8.field_2._M_local_buf[0]) + 1);
        }
        if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
          operator_delete((void *)local_e8._0_8_,CONCAT71(local_e8._17_7_,local_e8[0x10]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_p != &local_f8) {
          operator_delete(local_108._M_p,
                          CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) +
                          1);
        }
        GVar7 = (GlobalHandle)((long)GVar7 + 0xc);
      } while (GVar7 != (GlobalHandle)ppVar3);
    }
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_60);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  if ((GlobalHandle)
      local_138.
      super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (GlobalHandle)0x0) {
    operator_delete(local_138.
                    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CoreBroker::findAndNotifyFilterTargets(BasicHandleInfo& handleInfo, const std::string& key)
{
    auto Handles = unknownHandles.checkForFilters(key);
    for (const auto& target : Handles) {
        auto flags = target.second;
        if (checkActionFlag(handleInfo, clone_flag)) {
            flags |= make_flags(clone_flag);
        }
        connectInterfaces(handleInfo,
                          flags,
                          BasicHandleInfo(target.first.fed_id,
                                          target.first.handle,
                                          InterfaceType::ENDPOINT),

                          flags,
                          std::make_pair(CMD_ADD_FILTER, CMD_ADD_ENDPOINT));
    }

    auto FiltDestTargets = unknownHandles.checkForFilterDestTargets(key);
    for (const auto& target : FiltDestTargets) {
        ActionMessage link(CMD_ADD_NAMED_ENDPOINT);
        link.name(target);
        link.setSource(handleInfo.handle);
        link.flags = handleInfo.flags;
        setActionFlag(link, destination_target);
        if (checkActionFlag(handleInfo, clone_flag)) {
            setActionFlag(link, clone_flag);
        }
        checkForNamedInterface(link);
    }

    auto FiltSourceTargets = unknownHandles.checkForFilterSourceTargets(key);
    for (const auto& target : FiltSourceTargets) {
        ActionMessage link(CMD_ADD_NAMED_ENDPOINT);
        link.name(target);
        link.flags = handleInfo.flags;
        link.setSource(handleInfo.handle);
        if (checkActionFlag(handleInfo, clone_flag)) {
            setActionFlag(link, clone_flag);
        }
        checkForNamedInterface(link);
    }
    if (!(Handles.empty() && FiltDestTargets.empty() && FiltSourceTargets.empty())) {
        unknownHandles.clearFilter(key);
    }
    if (getBrokerState() == BrokerState::OPERATING) {
        Handles = unknownHandles.checkForFilters(key);
        for (const auto& target : Handles) {
            auto flags = target.second;
            if (checkActionFlag(handleInfo, clone_flag)) {
                flags |= make_flags(clone_flag);
            }
            connectInterfaces(handleInfo,
                              flags,
                              BasicHandleInfo(target.first.fed_id,
                                              target.first.handle,
                                              InterfaceType::ENDPOINT),

                              flags,
                              std::make_pair(CMD_ADD_FILTER, CMD_ADD_ENDPOINT));
        }
    }
}